

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltablib.c
# Opt level: O3

int tinsert(lua_State *L)

{
  int n;
  int iVar1;
  size_t sVar2;
  lua_Integer lVar3;
  
  luaL_checktype(L,1,5);
  sVar2 = lua_objlen(L,1);
  iVar1 = lua_gettop(L);
  if (iVar1 == 2) {
    iVar1 = (int)sVar2 + 1;
  }
  else {
    if (iVar1 != 3) {
      iVar1 = luaL_error(L,"wrong number of arguments to \'insert\'");
      return iVar1;
    }
    lVar3 = luaL_checkinteger(L,2);
    iVar1 = (int)lVar3;
    if (iVar1 <= (int)sVar2) {
      do {
        n = (int)sVar2;
        lua_rawgeti(L,1,n);
        lua_rawseti(L,1,n + 1);
        sVar2 = (size_t)(n - 1);
      } while (iVar1 < n);
    }
  }
  lua_rawseti(L,1,iVar1);
  return 0;
}

Assistant:

static int tinsert (lua_State *L) {
  int e = aux_getn(L, 1) + 1;  /* first empty element */
  int pos;  /* where to insert new element */
  switch (lua_gettop(L)) {
    case 2: {  /* called with only 2 arguments */
      pos = e;  /* insert new element at the end */
      break;
    }
    case 3: {
      int i;
      pos = luaL_checkint(L, 2);  /* 2nd argument is the position */
      if (pos > e) e = pos;  /* `grow' array if necessary */
      for (i = e; i > pos; i--) {  /* move up elements */
        lua_rawgeti(L, 1, i-1);
        lua_rawseti(L, 1, i);  /* t[i] = t[i-1] */
      }
      break;
    }
    default: {
      return luaL_error(L, "wrong number of arguments to " LUA_QL("insert"));
    }
  }
  luaL_setn(L, 1, e);  /* new size */
  lua_rawseti(L, 1, pos);  /* t[pos] = v */
  return 0;
}